

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

LetDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::LetDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::syntax::AssertionItemPortListSyntax*,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,AssertionItemPortListSyntax **args_3,Token *args_4,
          ExpressionSyntax *args_5,Token *args_6)

{
  Token identifier;
  Token semi;
  LetDeclarationSyntax *pLVar1;
  Token *in_RCX;
  undefined8 *in_RDX;
  Info *in_R9;
  Token *in_stack_00000010;
  size_t in_stack_ffffffffffffff58;
  size_t in_stack_ffffffffffffff60;
  BumpAllocator *in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff78;
  
  pLVar1 = (LetDeclarationSyntax *)
           allocate(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  identifier.info = (Info *)pLVar1;
  identifier.kind = (short)in_stack_ffffffffffffff78;
  identifier._2_1_ = (char)((ulong)in_stack_ffffffffffffff78 >> 0x10);
  identifier.numFlags.raw = (char)((ulong)in_stack_ffffffffffffff78 >> 0x18);
  identifier.rawLen = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  semi.info = in_R9;
  semi._0_8_ = in_RDX[1];
  slang::syntax::LetDeclarationSyntax::LetDeclarationSyntax
            ((LetDeclarationSyntax *)in_stack_00000010->info,
             *(SyntaxList<slang::syntax::AttributeInstanceSyntax> **)in_stack_00000010,
             *in_stack_00000010,identifier,(AssertionItemPortListSyntax *)in_R9->location,*in_RCX,
             (ExpressionSyntax *)*in_RDX,semi);
  return pLVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }